

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Base *pBVar2;
  size_t sVar3;
  undefined1 local_48 [8];
  DNAView v1;
  undefined1 local_28 [8];
  DNASlice s1;
  char **argv_local;
  int argc_local;
  
  s1._dna = (Base *)argv;
  if (argc != 2) {
    fprintf(_stderr,"Must specify mode, got %d args\n",(ulong)(uint)argc);
    exit(2);
  }
  iVar1 = strcmp(argv[1],"test");
  if (iVar1 == 0) {
    TestObject::clear(&gTester);
    testfromCStr();
    testContains();
    testDNASlice();
    TestObject::finish(&gTester);
  }
  iVar1 = strcmp(*(char **)(s1._dna + 2),"show");
  if (iVar1 == 0) {
    DNASlice::DNASlice((DNASlice *)local_28,"aggctca");
    printf("Created DNA slice: ");
    DNASlice::print((DNASlice *)local_28);
    putc(10,_stdout);
    pBVar2 = DNASlice::dna((DNASlice *)local_28);
    sVar3 = DNASlice::size((DNASlice *)local_28);
    DNAView::DNAView((DNAView *)local_48,pBVar2,sVar3 - 2);
    printf("Created a DNA view: ");
    pBVar2 = DNAView::dna((DNAView *)local_48);
    sVar3 = DNAView::size((DNAView *)local_48);
    DNA::print(pBVar2,sVar3);
    putc(10,_stdout);
    DNASlice::~DNASlice((DNASlice *)local_28);
  }
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
	
	if (std::strcmp(argv[1], "test") == 0) {
		gTester.clear();
		testfromCStr();
		testContains();
		testDNASlice();
		gTester.finish();
	}
	
	if (std::strcmp(argv[1], "show") == 0) {
		DNASlice s1("aggctca");
		std::printf("Created DNA slice: ");
		s1.print();
		std::putc('\n', stdout);
		DNAView v1(s1.dna(), s1.size() - 2);
		std::printf("Created a DNA view: ");
		DNA::print(v1.dna(), v1.size());
		std::putc('\n', stdout);
		
	}
	return 0;
}